

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::valid_alias_name_string(string *str)

{
  int iVar1;
  size_type sVar2;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffc0;
  char in_stack_ffffffffffffffc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> *in_stack_fffffffffffffff0;
  
  if (valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&valid_alias_name_string(std::__cxx11::string_const&)::
                                 badChars_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
      ::std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_
                         );
    }
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffffd0);
  return sVar2 == 0xffffffffffffffff;
}

Assistant:

inline bool valid_alias_name_string(const std::string &str) {
    static const std::string badChars(std::string("\n") + '\0');
    return (str.find_first_of(badChars) == std::string::npos);
}